

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O2

void __thiscall QtPrivate::ExceptionStore::setException(ExceptionStore *this,exception_ptr e)

{
  std::__exception_ptr::exception_ptr::operator=
            (&this->exceptionHolder,(exception_ptr *)e._M_exception_object);
  return;
}

Assistant:

void ExceptionStore::setException(std::exception_ptr e)
{
    Q_ASSERT(!hasException());
    exceptionHolder = e;
}